

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnReturnCall(SharedValidator *this,Location *loc,Var *func_var)

{
  Result rhs;
  Var local_a8;
  Enum local_5c;
  undefined1 local_58 [8];
  FuncType func_type;
  Var *func_var_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  func_type.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)func_var;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  this->expr_loc_ = loc;
  FuncType::FuncType((FuncType *)local_58);
  Var::Var(&local_a8,func_var);
  local_5c = (Enum)CheckFuncIndex(this,&local_a8,(FuncType *)local_58);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_5c);
  Var::~Var(&local_a8);
  rhs = TypeChecker::OnReturnCall
                  (&this->typechecker_,(TypeVector *)local_58,
                   (TypeVector *)
                   &func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
  Result::operator|=((Result *)((long)&this_local + 4),rhs);
  FuncType::~FuncType((FuncType *)local_58);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnReturnCall(const Location& loc, Var func_var) {
  Result result = Result::Ok;
  expr_loc_ = &loc;
  FuncType func_type;
  result |= CheckFuncIndex(func_var, &func_type);
  result |= typechecker_.OnReturnCall(func_type.params, func_type.results);
  return result;
}